

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O0

SUNErrCode SUNMatMatvec_Dense(SUNMatrix A,N_Vector x,N_Vector y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  sunrealtype *yd;
  sunrealtype *xd;
  sunrealtype *col_j;
  sunindextype j;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar2 = N_VGetArrayPointer(in_RSI);
  lVar3 = N_VGetArrayPointer(in_RDX);
  for (local_28 = 0; local_28 < *(long *)*in_RDI; local_28 = local_28 + 1) {
    *(undefined8 *)(lVar3 + local_28 * 8) = 0;
  }
  for (local_30 = 0; local_30 < *(long *)(*in_RDI + 8); local_30 = local_30 + 1) {
    lVar1 = *(long *)(*(long *)(*in_RDI + 0x20) + local_30 * 8);
    for (local_28 = 0; local_28 < *(long *)*in_RDI; local_28 = local_28 + 1) {
      *(double *)(lVar3 + local_28 * 8) =
           *(double *)(lVar1 + local_28 * 8) * *(double *)(lVar2 + local_30 * 8) +
           *(double *)(lVar3 + local_28 * 8);
    }
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatMatvec_Dense(SUNMatrix A, N_Vector x, N_Vector y)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;
  sunrealtype *col_j, *xd, *yd;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrixAndVectors(A, x, y), SUN_ERR_ARG_DIMSMISMATCH);

  /* access vector data (return if NULL data pointers) */
  xd = N_VGetArrayPointer(x);
  SUNCheckLastErr();
  yd = N_VGetArrayPointer(y);
  SUNCheckLastErr();

  SUNAssert(xd, SUN_ERR_MEM_FAIL);
  SUNAssert(yd, SUN_ERR_MEM_FAIL);
  SUNAssert(xd != yd, SUN_ERR_MEM_FAIL);

  /* Perform operation y = Ax */
  for (i = 0; i < SM_ROWS_D(A); i++) { yd[i] = ZERO; }
  for (j = 0; j < SM_COLUMNS_D(A); j++)
  {
    col_j = SM_COLUMN_D(A, j);
    for (i = 0; i < SM_ROWS_D(A); i++) { yd[i] += col_j[i] * xd[j]; }
  }
  return SUN_SUCCESS;
}